

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GraphicsAccessories.cpp
# Opt level: O0

TEXTURE_FORMAT
Diligent::TextureComponentAttribsToTextureFormat
          (COMPONENT_TYPE CompType,Uint32 ComponentSize,Uint32 NumComponents)

{
  Uint32 NumComponents_local;
  Uint32 ComponentSize_local;
  COMPONENT_TYPE CompType_local;
  
  switch(CompType) {
  case COMPONENT_TYPE_FLOAT:
    if (ComponentSize == 2) {
      if (NumComponents == 1) {
        return TEX_FORMAT_R16_FLOAT;
      }
      if (NumComponents == 2) {
        return TEX_FORMAT_RG16_FLOAT;
      }
      if (NumComponents == 4) {
        return TEX_FORMAT_RGBA16_FLOAT;
      }
    }
    else if (ComponentSize == 4) {
      switch(NumComponents) {
      case 1:
        return TEX_FORMAT_R32_FLOAT;
      case 2:
        return TEX_FORMAT_RG32_FLOAT;
      case 3:
        return TEX_FORMAT_RGB32_FLOAT;
      case 4:
        return TEX_FORMAT_RGBA32_FLOAT;
      }
    }
    break;
  case COMPONENT_TYPE_SNORM:
    if (ComponentSize == 1) {
      if (NumComponents == 1) {
        return TEX_FORMAT_R8_SNORM;
      }
      if (NumComponents == 2) {
        return TEX_FORMAT_RG8_SNORM;
      }
      if (NumComponents == 4) {
        return TEX_FORMAT_RGBA8_SNORM;
      }
    }
    else if (ComponentSize == 2) {
      if (NumComponents == 1) {
        return TEX_FORMAT_R16_SNORM;
      }
      if (NumComponents == 2) {
        return TEX_FORMAT_RG16_SNORM;
      }
      if (NumComponents == 4) {
        return TEX_FORMAT_RGBA16_SNORM;
      }
    }
    break;
  case COMPONENT_TYPE_UNORM:
    if (ComponentSize == 1) {
      if (NumComponents == 1) {
        return TEX_FORMAT_R8_UNORM;
      }
      if (NumComponents == 2) {
        return TEX_FORMAT_RG8_UNORM;
      }
      if (NumComponents == 4) {
        return TEX_FORMAT_RGBA8_UNORM;
      }
    }
    else if (ComponentSize != 2) {
      return TEX_FORMAT_UNKNOWN;
    }
    if (NumComponents == 1) {
      return TEX_FORMAT_R16_UNORM;
    }
    if (NumComponents == 2) {
      return TEX_FORMAT_RG16_UNORM;
    }
    if (NumComponents == 4) {
      return TEX_FORMAT_RGBA16_UNORM;
    }
    break;
  case COMPONENT_TYPE_UNORM_SRGB:
    if (ComponentSize == 1 && NumComponents == 4) {
      return TEX_FORMAT_RGBA8_UNORM_SRGB;
    }
    return TEX_FORMAT_UNKNOWN;
  case COMPONENT_TYPE_SINT:
    if (ComponentSize == 1) {
      if (NumComponents == 1) {
        return TEX_FORMAT_R8_SINT;
      }
      if (NumComponents == 2) {
        return TEX_FORMAT_RG8_SINT;
      }
      if (NumComponents == 4) {
        return TEX_FORMAT_RGBA8_SINT;
      }
    }
    else if (ComponentSize == 2) {
      if (NumComponents == 1) {
        return TEX_FORMAT_R16_SINT;
      }
      if (NumComponents == 2) {
        return TEX_FORMAT_RG16_SINT;
      }
      if (NumComponents == 4) {
        return TEX_FORMAT_RGBA16_SINT;
      }
    }
    else if (ComponentSize == 4) {
      switch(NumComponents) {
      case 1:
        return TEX_FORMAT_R32_SINT;
      case 2:
        return TEX_FORMAT_RG32_SINT;
      case 3:
        return TEX_FORMAT_RGB32_SINT;
      case 4:
        return TEX_FORMAT_RGBA32_SINT;
      }
    }
    break;
  case COMPONENT_TYPE_UINT:
    if (ComponentSize == 1) {
      if (NumComponents == 1) {
        return TEX_FORMAT_R8_UINT;
      }
      if (NumComponents == 2) {
        return TEX_FORMAT_RG8_UINT;
      }
      if (NumComponents == 4) {
        return TEX_FORMAT_RGBA8_UINT;
      }
    }
    else if (ComponentSize == 2) {
      if (NumComponents == 1) {
        return TEX_FORMAT_R16_UINT;
      }
      if (NumComponents == 2) {
        return TEX_FORMAT_RG16_UINT;
      }
      if (NumComponents == 4) {
        return TEX_FORMAT_RGBA16_UINT;
      }
    }
    else if (ComponentSize == 4) {
      switch(NumComponents) {
      case 1:
        return TEX_FORMAT_R32_UINT;
      case 2:
        return TEX_FORMAT_RG32_UINT;
      case 3:
        return TEX_FORMAT_RGB32_UINT;
      case 4:
        return TEX_FORMAT_RGBA32_UINT;
      }
    }
    break;
  case COMPONENT_TYPE_DEPTH:
    if (ComponentSize == 4 && NumComponents == 1) {
      return TEX_FORMAT_D32_FLOAT;
    }
    return TEX_FORMAT_UNKNOWN;
  }
  return TEX_FORMAT_UNKNOWN;
}

Assistant:

TEXTURE_FORMAT TextureComponentAttribsToTextureFormat(COMPONENT_TYPE CompType, Uint32 ComponentSize, Uint32 NumComponents)
{
    switch (CompType)
    {
        case COMPONENT_TYPE_FLOAT:
            switch (ComponentSize)
            {
                case 2:
                    switch (NumComponents)
                    {
                        case 1: return TEX_FORMAT_R16_FLOAT;
                        case 2: return TEX_FORMAT_RG16_FLOAT;
                        case 4: return TEX_FORMAT_RGBA16_FLOAT;
                    }
                    break;

                case 4:
                    switch (NumComponents)
                    {
                        case 1: return TEX_FORMAT_R32_FLOAT;
                        case 2: return TEX_FORMAT_RG32_FLOAT;
                        case 3: return TEX_FORMAT_RGB32_FLOAT;
                        case 4: return TEX_FORMAT_RGBA32_FLOAT;
                    }
                    break;
            }
            break;

        case COMPONENT_TYPE_SNORM:
            switch (ComponentSize)
            {
                case 1:
                    switch (NumComponents)
                    {
                        case 1: return TEX_FORMAT_R8_SNORM;
                        case 2: return TEX_FORMAT_RG8_SNORM;
                        case 4: return TEX_FORMAT_RGBA8_SNORM;
                    }
                    break;

                case 2:
                    switch (NumComponents)
                    {
                        case 1: return TEX_FORMAT_R16_SNORM;
                        case 2: return TEX_FORMAT_RG16_SNORM;
                        case 4: return TEX_FORMAT_RGBA16_SNORM;
                    }
                    break;
            }
            break;

        case COMPONENT_TYPE_UNORM:
            switch (ComponentSize)
            {
                case 1:
                    switch (NumComponents)
                    {
                        case 1: return TEX_FORMAT_R8_UNORM;
                        case 2: return TEX_FORMAT_RG8_UNORM;
                        case 4: return TEX_FORMAT_RGBA8_UNORM;
                    }

                case 2:
                    switch (NumComponents)
                    {
                        case 1: return TEX_FORMAT_R16_UNORM;
                        case 2: return TEX_FORMAT_RG16_UNORM;
                        case 4: return TEX_FORMAT_RGBA16_UNORM;
                    }
                    break;
            }
            break;

        case COMPONENT_TYPE_UNORM_SRGB:
            return ComponentSize == 1 && NumComponents == 4 ? TEX_FORMAT_RGBA8_UNORM_SRGB : TEX_FORMAT_UNKNOWN;

        case COMPONENT_TYPE_SINT:
            switch (ComponentSize)
            {
                case 1:
                    switch (NumComponents)
                    {
                        case 1: return TEX_FORMAT_R8_SINT;
                        case 2: return TEX_FORMAT_RG8_SINT;
                        case 4: return TEX_FORMAT_RGBA8_SINT;
                    }
                    break;

                case 2:
                    switch (NumComponents)
                    {
                        case 1: return TEX_FORMAT_R16_SINT;
                        case 2: return TEX_FORMAT_RG16_SINT;
                        case 4: return TEX_FORMAT_RGBA16_SINT;
                    }
                    break;

                case 4:
                    switch (NumComponents)
                    {
                        case 1: return TEX_FORMAT_R32_SINT;
                        case 2: return TEX_FORMAT_RG32_SINT;
                        case 3: return TEX_FORMAT_RGB32_SINT;
                        case 4: return TEX_FORMAT_RGBA32_SINT;
                    }
                    break;
            }
            break;

        case COMPONENT_TYPE_UINT:
            switch (ComponentSize)
            {
                case 1:
                    switch (NumComponents)
                    {
                        case 1: return TEX_FORMAT_R8_UINT;
                        case 2: return TEX_FORMAT_RG8_UINT;
                        case 4: return TEX_FORMAT_RGBA8_UINT;
                    }
                    break;

                case 2:
                    switch (NumComponents)
                    {
                        case 1: return TEX_FORMAT_R16_UINT;
                        case 2: return TEX_FORMAT_RG16_UINT;
                        case 4: return TEX_FORMAT_RGBA16_UINT;
                    }
                    break;

                case 4:
                    switch (NumComponents)
                    {
                        case 1: return TEX_FORMAT_R32_UINT;
                        case 2: return TEX_FORMAT_RG32_UINT;
                        case 3: return TEX_FORMAT_RGB32_UINT;
                        case 4: return TEX_FORMAT_RGBA32_UINT;
                    }
                    break;
            }
            break;

        case COMPONENT_TYPE_DEPTH:
            return ComponentSize == 4 && NumComponents == 1 ? TEX_FORMAT_D32_FLOAT : TEX_FORMAT_UNKNOWN;

        default:
            break;
    }

    return TEX_FORMAT_UNKNOWN;
}